

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::OrphanBuilder::asCapability(OrphanBuilder *this)

{
  ClientHook *extraout_RDX;
  int *in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar1;
  Fault f;
  SegmentBuilder *local_60;
  BrokenCapFactory *brokenCapFactory;
  DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> _kjCondition;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> maybeCap;
  
  maybeCap.ptr.disposer = (Disposer *)0x0;
  maybeCap.ptr.ptr = (ClientHook *)0x0;
  _kjCondition.left = &brokenCapFactory;
  brokenCapFactory = globalBrokenCapFactory;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = anon_var_dwarf_43885;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = globalBrokenCapFactory != (BrokenCapFactory *)0x0;
  if (_kjCondition.result) {
    if (in_RSI[1] == 0 && *in_RSI == 0) {
      (**(code **)(*(long *)globalBrokenCapFactory + 8))(this,globalBrokenCapFactory);
    }
    else if (*in_RSI == 3) {
      (**(code **)**(undefined8 **)(in_RSI + 4))(&f);
      _kjCondition.left = (BrokenCapFactory **)f.exception;
      _kjCondition.right = local_60;
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&f);
      if (local_60 == (SegmentBuilder *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x8c4,FAILED,(char *)0x0,"\"Message contains invalid capability pointer.\"",
                   (char (*) [45])"Message contains invalid capability pointer.");
        kj::_::Debug::Fault::~Fault(&f);
        (*(code *)**(undefined8 **)brokenCapFactory)
                  (this,brokenCapFactory,"Calling invalid capability pointer.",0x24);
      }
      else {
        (this->tag).content = (uint64_t)f.exception;
        this->segment = local_60;
        _kjCondition.right = (void *)0x0;
      }
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[96]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8bc,FAILED,(char *)0x0,
                 "\"Schema mismatch: Message contains non-capability pointer where capability pointer was \" \"expected.\""
                 ,(char (*) [96])
                  "Schema mismatch: Message contains non-capability pointer where capability pointer was expected."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
      (*(code *)**(undefined8 **)brokenCapFactory)
                (this,brokenCapFactory,"Calling capability extracted from a non-capability pointer."
                 ,0x3c);
    }
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&maybeCap.ptr);
    OVar1.ptr = extraout_RDX;
    OVar1.disposer = (Disposer *)this;
    return OVar1;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::BrokenCapFactory*&,decltype(nullptr)>&,char_const(&)[192]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0x8b5,FAILED,"brokenCapFactory != nullptr",
             "_kjCondition,\"Trying to read capabilities without ever having created a capability context.  \" \"To read capabilities from a message, you must imbue it with CapReaderContext, or \" \"use the Cap\'n Proto RPC system.\""
             ,&_kjCondition,
             (char (*) [192])
             "Trying to read capabilities without ever having created a capability context.  To read capabilities from a message, you must imbue it with CapReaderContext, or use the Cap\'n Proto RPC system."
            );
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Own<ClientHook> OrphanBuilder::asCapability() const {
  return WireHelpers::readCapabilityPointer(segment, capTable, tagAsPtr(), kj::maxValue);
}